

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParenthesizedBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenthesizedBinsSelectExprSyntax,slang::syntax::ParenthesizedBinsSelectExprSyntax_const&>
          (BumpAllocator *this,ParenthesizedBinsSelectExprSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  BinsSelectExpressionSyntax *pBVar4;
  Info *pIVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ParenthesizedBinsSelectExprSyntax *pPVar15;
  
  pPVar15 = (ParenthesizedBinsSelectExprSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_BinsSelectExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->openParen).kind;
  uVar8 = (args->openParen).field_0x2;
  NVar9.raw = (args->openParen).numFlags.raw;
  uVar10 = (args->openParen).rawLen;
  pIVar3 = (args->openParen).info;
  pBVar4 = (args->expr).ptr;
  TVar11 = (args->closeParen).kind;
  uVar12 = (args->closeParen).field_0x2;
  NVar13.raw = (args->closeParen).numFlags.raw;
  uVar14 = (args->closeParen).rawLen;
  pIVar5 = (args->closeParen).info;
  (pPVar15->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind =
       (args->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar15->super_BinsSelectExpressionSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pPVar15->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pPVar15->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pPVar15->openParen).kind = TVar7;
  (pPVar15->openParen).field_0x2 = uVar8;
  (pPVar15->openParen).numFlags = (NumericTokenFlags)NVar9.raw;
  (pPVar15->openParen).rawLen = uVar10;
  (pPVar15->openParen).info = pIVar3;
  (pPVar15->expr).ptr = pBVar4;
  (pPVar15->closeParen).kind = TVar11;
  (pPVar15->closeParen).field_0x2 = uVar12;
  (pPVar15->closeParen).numFlags = (NumericTokenFlags)NVar13.raw;
  (pPVar15->closeParen).rawLen = uVar14;
  (pPVar15->closeParen).info = pIVar5;
  return pPVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }